

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v8::detail::
for_each_codepoint<fmt::v8::detail::compute_width(fmt::v8::basic_string_view<char>)::count_code_points>
          (detail *this,string_view s,count_code_points f)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  type size;
  size_t __n;
  char *pcVar4;
  char *pcVar5;
  detail *__src;
  byte *pbVar6;
  string_view sVar7;
  string_view sVar8;
  byte local_48 [8];
  char buf [7];
  count_code_points local_38;
  anon_class_8_1_54a39806 decode;
  
  local_38.count = (size_t *)s.size_;
  pcVar4 = s.data_;
  pcVar5 = pcVar4;
  __src = this;
  if (pcVar4 < (char *)0x4) {
LAB_0019fba4:
    __n = (long)(this + (long)pcVar5) - (long)__src;
    if (__n != 0) {
      local_48[4] = 0;
      local_48[5] = 0;
      local_48[6] = 0;
      local_48[0] = 0;
      local_48[1] = 0;
      local_48[2] = 0;
      local_48[3] = 0;
      memcpy(local_48,__src,__n);
      pbVar6 = local_48;
      do {
        sVar2 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                      [*pbVar6 >> 3] +
                (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                              [*pbVar6 >> 3] == 0);
        uVar3 = (pbVar6[3] & 0x3f |
                (pbVar6[2] & 0x3f) << 6 |
                (pbVar6[1] & 0x3f) << 0xc |
                ((int)(char)*pbVar6 & *(uint *)(&DAT_001f47c0 + sVar2 * 4)) << 0x12) >>
                ((&DAT_001f4800)[sVar2 * 4] & 0x1f);
        sVar8.size_ = sVar2;
        sVar8.data_ = (char *)__src;
        bVar1 = anon_func::count_code_points::operator()
                          (&local_38,
                           -(uint)((((pbVar6[1] >> 2 & 0xfffffff0) + (uint)(pbVar6[2] >> 6) * 4 |
                                     (uint)(pbVar6[3] >> 6) |
                                     (uint)(uVar3 < *(uint *)(&DAT_001f47e0 + sVar2 * 4)) << 6 |
                                     (uint)(0x10ffff < uVar3) << 8 |
                                    (uint)((uVar3 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                   ((&DAT_001f4820)[sVar2 * 4] & 0x1f) != 0) | uVar3,sVar8);
        if (!bVar1) {
          return;
        }
        pbVar6 = pbVar6 + sVar2;
        __src = __src + sVar2;
      } while ((long)pbVar6 - (long)local_48 < (long)__n);
    }
  }
  else {
    _buf = pcVar4;
    do {
      pcVar5 = _buf;
      if (this + (long)pcVar4 + -3 <= __src) goto LAB_0019fba4;
      sVar2 = (long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                    [(byte)*__src >> 3] +
              (ulong)((long)"\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01"
                            [(byte)*__src >> 3] == 0);
      uVar3 = ((byte)__src[3] & 0x3f |
              ((byte)__src[2] & 0x3f) << 6 |
              ((byte)__src[1] & 0x3f) << 0xc |
              ((int)(char)*__src & *(uint *)(&DAT_001f47c0 + sVar2 * 4)) << 0x12) >>
              ((&DAT_001f4800)[sVar2 * 4] & 0x1f);
      sVar7.size_ = sVar2;
      sVar7.data_ = (char *)__src;
      bVar1 = anon_func::count_code_points::operator()
                        (&local_38,
                         -(uint)(((((byte)__src[1] >> 2 & 0xfffffff0) +
                                   (uint)((byte)__src[2] >> 6) * 4 | (uint)((byte)__src[3] >> 6) |
                                   (uint)(uVar3 < *(uint *)(&DAT_001f47e0 + sVar2 * 4)) << 6 |
                                   (uint)(0x10ffff < uVar3) << 8 |
                                  (uint)((uVar3 & 0xfffff800) == 0xd800) << 7) ^ 0x2a) >>
                                 ((&DAT_001f4820)[sVar2 * 4] & 0x1f) != 0) | uVar3,sVar7);
      __src = __src + sVar2;
    } while (bVar1);
  }
  return;
}

Assistant:

FMT_CONSTEXPR void for_each_codepoint(string_view s, F f) {
  auto decode = [f](const char* buf_ptr, const char* ptr) {
    auto cp = uint32_t();
    auto error = 0;
    auto end = utf8_decode(buf_ptr, &cp, &error);
    bool result = f(error ? invalid_code_point : cp,
                    string_view(ptr, to_unsigned(end - buf_ptr)));
    return result ? end : nullptr;
  };
  auto p = s.data();
  const size_t block_size = 4;  // utf8_decode always reads blocks of 4 chars.
  if (s.size() >= block_size) {
    for (auto end = p + s.size() - block_size + 1; p < end;) {
      p = decode(p, p);
      if (!p) return;
    }
  }
  if (auto num_chars_left = s.data() + s.size() - p) {
    char buf[2 * block_size - 1] = {};
    copy_str<char>(p, p + num_chars_left, buf);
    const char* buf_ptr = buf;
    do {
      auto end = decode(buf_ptr, p);
      if (!end) return;
      p += end - buf_ptr;
      buf_ptr = end;
    } while (buf_ptr - buf < num_chars_left);
  }
}